

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

LZ4_stream_t * duckdb_lz4::LZ4_createStream(void)

{
  LZ4_stream_t *pLVar1;
  
  pLVar1 = (LZ4_stream_t *)malloc(0x4020);
  if (((ulong)pLVar1 & 7) == 0 && pLVar1 != (LZ4_stream_t *)0x0) {
    pLVar1 = (LZ4_stream_t *)switchD_012e3010::default(pLVar1,0,0x4020);
    return pLVar1;
  }
  return pLVar1;
}

Assistant:

LZ4_stream_t* LZ4_createStream(void)
{
    LZ4_stream_t* const lz4s = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));
    LZ4_STATIC_ASSERT(sizeof(LZ4_stream_t) >= sizeof(LZ4_stream_t_internal));
    DEBUGLOG(4, "LZ4_createStream %p", lz4s);
    if (lz4s == NULL) return NULL;
    LZ4_initStream(lz4s, sizeof(*lz4s));
    return lz4s;
}